

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_libc.c
# Opt level: O0

bool_t GetDatePacked(datetime_t t,datepack_t *tp,bool_t Local)

{
  tm *local_38;
  tm *date;
  time_t ot;
  bool_t Local_local;
  datepack_t *tp_local;
  bool_t bStack_10;
  datetime_t t_local;
  
  if ((tp == (datepack_t *)0x0) || (t == 0)) {
    bStack_10 = 0;
  }
  else {
    date = (tm *)(long)(t + 0x3a4fc880);
    ot = Local;
    Local_local = (bool_t)tp;
    tp_local._4_4_ = t;
    if (Local == 0) {
      local_38 = gmtime((time_t *)&date);
    }
    else {
      local_38 = localtime((time_t *)&date);
    }
    if (local_38 == (tm *)0x0) {
      bStack_10 = 0;
    }
    else {
      *(long *)(Local_local + 0x28) = (long)local_38->tm_sec;
      *(long *)(Local_local + 0x20) = (long)local_38->tm_min;
      *(long *)(Local_local + 0x18) = (long)local_38->tm_hour;
      *(long *)(Local_local + 0x10) = (long)local_38->tm_mday;
      *(long *)(Local_local + 8) = (long)(local_38->tm_mon + 1);
      *(long *)Local_local = (long)(local_38->tm_year + 0x76c);
      *(long *)(Local_local + 0x30) = (long)(local_38->tm_wday + 1);
      bStack_10 = 1;
    }
  }
  return bStack_10;
}

Assistant:

bool_t GetDatePacked(datetime_t t, datepack_t *tp, bool_t Local)
{
	time_t ot;
	struct tm *date;

	if (!tp || t == INVALID_DATETIME_T)
        return 0;

	ot = t + DATETIME_OFFSET;
    if (Local)
        date = localtime(&ot);
    else
	    date = gmtime(&ot);

	if (date)
    {
		tp->Second = date->tm_sec;
		tp->Minute = date->tm_min;
		tp->Hour = date->tm_hour;
		tp->Day = date->tm_mday;
		tp->Month = date->tm_mon + 1;
		tp->Year = date->tm_year + 1900;
		tp->WeekDay = date->tm_wday + 1;
		return 1;
	}

	return 0;
}